

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_striped_avx2_256_32.c
# Opt level: O1

parasail_result_t *
parasail_sw_stats_table_striped_profile_avx2_256_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  __m256i alVar4;
  undefined1 auVar5 [32];
  undefined4 uVar6;
  void *pvVar7;
  parasail_matrix_t *ppVar8;
  void *pvVar9;
  void *pvVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  uint uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  __m256i c;
  __m256i c_00;
  __m256i c_01;
  __m256i c_02;
  __m256i c_03;
  __m256i c_04;
  __m256i c_05;
  __m256i *palVar20;
  __m256i *palVar21;
  __m256i *palVar22;
  __m256i *palVar23;
  ulong uVar24;
  parasail_result_t *result;
  __m256i *b;
  __m256i *palVar25;
  __m256i *b_00;
  __m256i *b_01;
  __m256i *b_02;
  __m256i *palVar26;
  __m256i *b_03;
  __m256i *b_04;
  __m256i *b_05;
  __m256i *b_06;
  int iVar27;
  uint uVar28;
  int iVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  __m256i *ptr;
  long lVar33;
  long lVar34;
  ulong uVar35;
  uint uVar36;
  long lVar37;
  long lVar38;
  __m256i *ptr_00;
  __m256i *palVar39;
  __m256i *ptr_01;
  int iVar40;
  long lVar41;
  __m256i *ptr_02;
  ulong size;
  __m256i *ptr_03;
  bool bVar42;
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [64];
  undefined1 auVar48 [32];
  undefined1 auVar49 [64];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [16];
  undefined1 auVar55 [64];
  undefined1 auVar56 [32];
  undefined1 auVar57 [64];
  int32_t column_len;
  undefined8 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd84;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  int iVar58;
  __m256i *local_268;
  __m256i *local_260;
  int local_254;
  __m256i *local_250;
  __m256i *local_248;
  __m256i *local_240;
  __m256i *local_238;
  __m256i *local_228;
  __m256i *local_218;
  ulong local_1e8;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined1 local_b8 [32];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_stats_table_striped_profile_avx2_256_32_cold_8();
  }
  else {
    pvVar7 = (profile->profile32).score;
    if (pvVar7 == (void *)0x0) {
      parasail_sw_stats_table_striped_profile_avx2_256_32_cold_7();
    }
    else {
      ppVar8 = profile->matrix;
      if (ppVar8 == (parasail_matrix_t *)0x0) {
        parasail_sw_stats_table_striped_profile_avx2_256_32_cold_6();
      }
      else {
        uVar36 = profile->s1Len;
        uVar24 = (ulong)uVar36;
        if ((int)uVar36 < 1) {
          parasail_sw_stats_table_striped_profile_avx2_256_32_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_stats_table_striped_profile_avx2_256_32_cold_4();
        }
        else {
          uVar35 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_sw_stats_table_striped_profile_avx2_256_32_cold_3();
          }
          else if (open < 0) {
            parasail_sw_stats_table_striped_profile_avx2_256_32_cold_2();
          }
          else if (gap < 0) {
            parasail_sw_stats_table_striped_profile_avx2_256_32_cold_1();
          }
          else {
            uVar1 = uVar24 + 7;
            pvVar9 = (profile->profile32).matches;
            pvVar10 = (profile->profile32).similar;
            iVar27 = ppVar8->max;
            result = parasail_result_new_table3((uint)uVar1 & 0x7ffffff8,s2Len);
            if (result != (parasail_result_t *)0x0) {
              size = uVar1 >> 3;
              result->flag = result->flag | 0x8430804;
              b = parasail_memalign___m256i(0x20,size);
              palVar25 = parasail_memalign___m256i(0x20,size);
              b_00 = parasail_memalign___m256i(0x20,size);
              local_218 = parasail_memalign___m256i(0x20,size);
              b_01 = parasail_memalign___m256i(0x20,size);
              local_250 = parasail_memalign___m256i(0x20,size);
              b_02 = parasail_memalign___m256i(0x20,size);
              palVar26 = parasail_memalign___m256i(0x20,size);
              b_03 = parasail_memalign___m256i(0x20,size);
              b_04 = parasail_memalign___m256i(0x20,size);
              b_05 = parasail_memalign___m256i(0x20,size);
              b_06 = parasail_memalign___m256i(0x20,size);
              local_238 = parasail_memalign___m256i(0x20,size);
              local_240 = parasail_memalign___m256i(0x20,size);
              local_248 = parasail_memalign___m256i(0x20,size);
              local_228 = parasail_memalign___m256i(0x20,size);
              if (b == (__m256i *)0x0) {
                return (parasail_result_t *)0x0;
              }
              if (palVar25 == (__m256i *)0x0) {
                return (parasail_result_t *)0x0;
              }
              if (b_00 == (__m256i *)0x0) {
                return (parasail_result_t *)0x0;
              }
              if (local_218 == (__m256i *)0x0) {
                return (parasail_result_t *)0x0;
              }
              if (b_01 == (__m256i *)0x0) {
                return (parasail_result_t *)0x0;
              }
              if (local_250 == (__m256i *)0x0) {
                return (parasail_result_t *)0x0;
              }
              if (b_02 == (__m256i *)0x0) {
                return (parasail_result_t *)0x0;
              }
              if (palVar26 == (__m256i *)0x0) {
                return (parasail_result_t *)0x0;
              }
              if (b_03 == (__m256i *)0x0) {
                return (parasail_result_t *)0x0;
              }
              if (b_04 == (__m256i *)0x0) {
                return (parasail_result_t *)0x0;
              }
              if (b_05 == (__m256i *)0x0) {
                return (parasail_result_t *)0x0;
              }
              if (b_06 == (__m256i *)0x0) {
                return (parasail_result_t *)0x0;
              }
              if (local_238 == (__m256i *)0x0) {
                return (parasail_result_t *)0x0;
              }
              if (local_240 == (__m256i *)0x0) {
                return (parasail_result_t *)0x0;
              }
              if (local_248 == (__m256i *)0x0) {
                return (parasail_result_t *)0x0;
              }
              if (local_228 == (__m256i *)0x0) {
                return (parasail_result_t *)0x0;
              }
              alVar4[1]._0_4_ = open;
              alVar4[0] = in_stack_fffffffffffffd78;
              alVar4[1]._4_4_ = in_stack_fffffffffffffd84;
              alVar4[2] = (longlong)palVar26;
              alVar4[3]._0_4_ = in_stack_fffffffffffffd90;
              alVar4[3]._4_4_ = in_stack_fffffffffffffd94;
              iVar58 = open;
              parasail_memset___m256i(b,alVar4,size);
              c[1]._0_4_ = iVar58;
              c[0] = in_stack_fffffffffffffd78;
              c[1]._4_4_ = in_stack_fffffffffffffd84;
              c[2] = (longlong)palVar26;
              c[3]._0_4_ = in_stack_fffffffffffffd90;
              c[3]._4_4_ = in_stack_fffffffffffffd94;
              parasail_memset___m256i(b_00,c,size);
              c_00[1]._0_4_ = iVar58;
              c_00[0] = in_stack_fffffffffffffd78;
              c_00[1]._4_4_ = in_stack_fffffffffffffd84;
              c_00[2] = (longlong)palVar26;
              c_00[3]._0_4_ = in_stack_fffffffffffffd90;
              c_00[3]._4_4_ = in_stack_fffffffffffffd94;
              parasail_memset___m256i(b_01,c_00,size);
              c_01[1]._0_4_ = iVar58;
              c_01[0] = in_stack_fffffffffffffd78;
              c_01[1]._4_4_ = in_stack_fffffffffffffd84;
              c_01[2] = (longlong)palVar26;
              c_01[3]._0_4_ = in_stack_fffffffffffffd90;
              c_01[3]._4_4_ = in_stack_fffffffffffffd94;
              parasail_memset___m256i(b_02,c_01,size);
              c_02[1]._0_4_ = iVar58;
              c_02[0] = in_stack_fffffffffffffd78;
              c_02[1]._4_4_ = in_stack_fffffffffffffd84;
              c_02[2] = (longlong)palVar26;
              c_02[3]._0_4_ = in_stack_fffffffffffffd90;
              c_02[3]._4_4_ = in_stack_fffffffffffffd94;
              parasail_memset___m256i(b_03,c_02,size);
              c_03[1]._0_4_ = iVar58;
              c_03[0] = in_stack_fffffffffffffd78;
              c_03[1]._4_4_ = in_stack_fffffffffffffd84;
              c_03[2] = (longlong)palVar26;
              c_03[3]._0_4_ = in_stack_fffffffffffffd90;
              c_03[3]._4_4_ = in_stack_fffffffffffffd94;
              parasail_memset___m256i(b_04,c_03,size);
              c_04[1]._0_4_ = iVar58;
              c_04[0] = in_stack_fffffffffffffd78;
              c_04[1]._4_4_ = in_stack_fffffffffffffd84;
              c_04[2] = (longlong)palVar26;
              c_04[3]._0_4_ = in_stack_fffffffffffffd90;
              c_04[3]._4_4_ = in_stack_fffffffffffffd94;
              parasail_memset___m256i(b_05,c_04,size);
              c_05[1]._0_4_ = iVar58;
              c_05[0] = in_stack_fffffffffffffd78;
              c_05[1]._4_4_ = in_stack_fffffffffffffd84;
              c_05[2] = (longlong)palVar26;
              c_05[3]._0_4_ = in_stack_fffffffffffffd90;
              c_05[3]._4_4_ = in_stack_fffffffffffffd94;
              parasail_memset___m256i(b_06,c_05,size);
              uVar16 = (uint)size;
              uVar28 = uVar16 - 1;
              lVar37 = size * uVar35;
              lVar2 = lVar37 * 4;
              lVar3 = lVar37 * 8;
              lVar17 = lVar37 * 0xc;
              lVar19 = lVar37 * 0x1c;
              lVar38 = lVar37 * 0x10;
              lVar18 = lVar37 * 0x14;
              lVar37 = lVar37 * 0x18;
              iVar58 = -0x40000000;
              lVar34 = 0;
              uVar32 = 0;
              auVar55 = ZEXT1664((undefined1  [16])0x0);
              local_b8 = ZEXT1632(ZEXT816(0));
              auVar53 = ZEXT1664((undefined1  [16])0x0);
              local_254 = 0;
              do {
                local_260 = b_01;
                local_268 = b_02;
                palVar39 = b_00;
                ptr_00 = b;
                b_01 = local_250;
                lVar30 = (long)(int)(ppVar8->mapper[(byte)s2[uVar32]] * uVar16) * 0x20;
                bVar42 = local_254 == (int)uVar32 + -2;
                b_02 = palVar26;
                palVar20 = local_248;
                if (bVar42) {
                  b_02 = local_228;
                  local_228 = palVar26;
                  palVar20 = local_250;
                }
                local_250 = local_260;
                if (bVar42) {
                  b_01 = local_248;
                }
                b = palVar25;
                palVar26 = local_240;
                b_00 = local_218;
                if (bVar42) {
                  b = local_238;
                  local_238 = palVar25;
                  palVar26 = local_218;
                  b_00 = local_240;
                }
                local_240 = palVar26;
                alVar4 = local_268[uVar28];
                auVar43 = vperm2i128_avx2((undefined1  [32])alVar4,(undefined1  [32])alVar4,0x28);
                auVar11 = vpalignr_avx2((undefined1  [32])alVar4,auVar43,0xc);
                alVar4 = local_260[uVar28];
                auVar43 = vperm2i128_avx2((undefined1  [32])alVar4,(undefined1  [32])alVar4,0x28);
                auVar44 = vpalignr_avx2((undefined1  [32])alVar4,auVar43,0xc);
                alVar4 = palVar39[uVar28];
                auVar43 = vperm2i128_avx2((undefined1  [32])alVar4,(undefined1  [32])alVar4,0x28);
                auVar45 = vpalignr_avx2((undefined1  [32])alVar4,auVar43,0xc);
                alVar4 = ptr_00[uVar28];
                auVar43 = vperm2i128_avx2((undefined1  [32])alVar4,(undefined1  [32])alVar4,0x28);
                auVar43 = vpalignr_avx2((undefined1  [32])alVar4,auVar43,0xc);
                lVar31 = 0;
                auVar57 = ZEXT3264(CONCAT428(1,CONCAT424(1,CONCAT420(1,CONCAT416(1,CONCAT412(1,
                                                  CONCAT48(1,0x100000001)))))));
                auVar47 = ZEXT1664((undefined1  [16])0x0);
                auVar49 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar52 = ZEXT1664((undefined1  [16])0x0);
                lVar33 = lVar34;
                do {
                  auVar48 = *(undefined1 (*) [32])((long)*b_03 + lVar31);
                  auVar43 = vpaddd_avx2(auVar43,*(undefined1 (*) [32])
                                                 ((long)pvVar7 + lVar31 + lVar30));
                  auVar13 = vpmaxsd_avx2(auVar43,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                  auVar14 = vpmaxsd_avx2(auVar13,auVar48);
                  auVar50 = auVar52._0_32_;
                  auVar15 = vpmaxsd_avx2(auVar14,auVar50);
                  auVar43 = *(undefined1 (*) [32])((long)*b_04 + lVar31);
                  auVar46 = *(undefined1 (*) [32])((long)*b_05 + lVar31);
                  auVar5 = *(undefined1 (*) [32])((long)*b_06 + lVar31);
                  *(undefined1 (*) [32])((long)*b + lVar31) = auVar15;
                  auVar12 = vpcmpeqd_avx2(auVar15,auVar13);
                  auVar56 = vpcmpgtd_avx2(auVar14,auVar50);
                  auVar13 = vblendvps_avx(auVar49._0_32_,auVar43,auVar56);
                  auVar45 = vpaddd_avx2(auVar45,*(undefined1 (*) [32])
                                                 ((long)pvVar9 + lVar31 + lVar30));
                  auVar45 = vblendvps_avx(auVar13,auVar45,auVar12);
                  auVar51 = vpcmpeqd_avx2(auVar15,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                  auVar13 = vpandn_avx2(auVar51,auVar45);
                  *(undefined1 (*) [32])((long)*b_00 + lVar31) = auVar13;
                  auVar45 = vblendvps_avx(auVar47._0_32_,auVar46,auVar56);
                  auVar44 = vpaddd_avx2(auVar44,*(undefined1 (*) [32])
                                                 ((long)pvVar10 + lVar31 + lVar30));
                  auVar45 = vblendvps_avx(auVar45,auVar44,auVar12);
                  auVar14 = vpandn_avx2(auVar51,auVar45);
                  *(undefined1 (*) [32])((long)*b_01 + lVar31) = auVar14;
                  auVar45 = vblendvps_avx(auVar57._0_32_,auVar5,auVar56);
                  auVar44 = vpcmpeqd_avx2(auVar56,auVar56);
                  auVar44 = vpsubd_avx2(auVar11,auVar44);
                  auVar45 = vblendvps_avx(auVar45,auVar44,auVar12);
                  auVar11 = vpandn_avx2(auVar51,auVar45);
                  *(undefined1 (*) [32])((long)*b_02 + lVar31) = auVar11;
                  lVar41 = *(long *)((long)((result->field_4).trace)->trace_del_table + 8);
                  *(int *)(lVar41 + lVar33) = auVar13._0_4_;
                  lVar41 = lVar41 + lVar33;
                  *(int *)(lVar2 + lVar41) = auVar13._4_4_;
                  *(int *)(lVar3 + lVar41) = auVar13._8_4_;
                  *(int *)(lVar17 + lVar41) = auVar13._12_4_;
                  *(int *)(lVar38 + lVar41) = auVar13._16_4_;
                  *(int *)(lVar18 + lVar41) = auVar13._20_4_;
                  *(int *)(lVar37 + lVar41) = auVar13._24_4_;
                  *(int *)(lVar19 + lVar41) = auVar13._28_4_;
                  lVar41 = *(long *)((long)((result->field_4).trace)->trace_del_table + 0x10);
                  *(int *)(lVar41 + lVar33) = auVar14._0_4_;
                  lVar41 = lVar41 + lVar33;
                  *(int *)(lVar2 + lVar41) = auVar14._4_4_;
                  *(int *)(lVar3 + lVar41) = auVar14._8_4_;
                  *(int *)(lVar17 + lVar41) = auVar14._12_4_;
                  *(int *)(lVar38 + lVar41) = auVar14._16_4_;
                  *(int *)(lVar18 + lVar41) = auVar14._20_4_;
                  *(int *)(lVar37 + lVar41) = auVar14._24_4_;
                  *(int *)(lVar19 + lVar41) = auVar14._28_4_;
                  lVar41 = *(long *)((long)((result->field_4).trace)->trace_del_table + 0x18);
                  *(int *)(lVar41 + lVar33) = auVar11._0_4_;
                  lVar41 = lVar41 + lVar33;
                  *(int *)(lVar2 + lVar41) = auVar11._4_4_;
                  *(int *)(lVar3 + lVar41) = auVar11._8_4_;
                  *(int *)(lVar17 + lVar41) = auVar11._12_4_;
                  *(int *)(lVar38 + lVar41) = auVar11._16_4_;
                  *(int *)(lVar18 + lVar41) = auVar11._20_4_;
                  *(int *)(lVar37 + lVar41) = auVar11._24_4_;
                  *(int *)(lVar19 + lVar41) = auVar11._28_4_;
                  lVar41 = *((result->field_4).trace)->trace_del_table;
                  *(int *)(lVar41 + lVar33) = auVar15._0_4_;
                  lVar41 = lVar41 + lVar33;
                  *(int *)(lVar2 + lVar41) = auVar15._4_4_;
                  *(int *)(lVar3 + lVar41) = auVar15._8_4_;
                  *(int *)(lVar17 + lVar41) = auVar15._12_4_;
                  *(int *)(lVar38 + lVar41) = auVar15._16_4_;
                  *(int *)(lVar18 + lVar41) = auVar15._20_4_;
                  *(int *)(lVar37 + lVar41) = auVar15._24_4_;
                  *(int *)(lVar19 + lVar41) = auVar15._28_4_;
                  auVar45._4_4_ = open;
                  auVar45._0_4_ = open;
                  auVar45._8_4_ = open;
                  auVar45._12_4_ = open;
                  auVar45._16_4_ = open;
                  auVar45._20_4_ = open;
                  auVar45._24_4_ = open;
                  auVar45._28_4_ = open;
                  auVar12 = vpsubd_avx2(auVar15,auVar45);
                  auVar56._4_4_ = gap;
                  auVar56._0_4_ = gap;
                  auVar56._8_4_ = gap;
                  auVar56._12_4_ = gap;
                  auVar56._16_4_ = gap;
                  auVar56._20_4_ = gap;
                  auVar56._24_4_ = gap;
                  auVar56._28_4_ = gap;
                  auVar51 = vpsubd_avx2(auVar48,auVar56);
                  auVar48 = vpcmpgtd_avx2(auVar12,auVar51);
                  auVar45 = vblendvps_avx(auVar43,auVar13,auVar48);
                  auVar44 = vblendvps_avx(auVar46,auVar14,auVar48);
                  auVar43 = vpcmpeqd_avx2(auVar43,auVar43);
                  auVar46 = vpsubd_avx2(auVar5,auVar43);
                  auVar5 = vpsubd_avx2(auVar11,auVar43);
                  auVar43 = vblendvps_avx(auVar46,auVar5,auVar48);
                  auVar48 = vpmaxsd_avx2(auVar13,auVar55._0_32_);
                  auVar11 = vpmaxsd_avx2(auVar14,auVar11);
                  auVar11 = vpmaxsd_avx2(auVar48,auVar11);
                  auVar55 = ZEXT3264(auVar11);
                  auVar11 = vpmaxsd_avx2(auVar12,auVar51);
                  *(undefined1 (*) [32])((long)*b_03 + lVar31) = auVar11;
                  *(undefined1 (*) [32])((long)*b_04 + lVar31) = auVar45;
                  *(undefined1 (*) [32])((long)*b_05 + lVar31) = auVar44;
                  *(undefined1 (*) [32])((long)*b_06 + lVar31) = auVar43;
                  auVar44 = vpsubd_avx2(auVar50,auVar56);
                  auVar45 = vpcmpgtd_avx2(auVar12,auVar44);
                  auVar43 = vblendvps_avx(auVar49._0_32_,auVar13,auVar45);
                  auVar49 = ZEXT3264(auVar43);
                  auVar43 = vblendvps_avx(auVar47._0_32_,auVar14,auVar45);
                  auVar47 = ZEXT3264(auVar43);
                  auVar43 = vpmaxsd_avx2(auVar15,auVar53._0_32_);
                  auVar53 = ZEXT3264(auVar43);
                  auVar43 = vpsubd_avx2(auVar57._0_32_,_DAT_008d4ac0);
                  auVar43 = vblendvps_avx(auVar43,auVar5,auVar45);
                  auVar57 = ZEXT3264(auVar43);
                  auVar43 = vpmaxsd_avx2(auVar12,auVar44);
                  auVar52 = ZEXT3264(auVar43);
                  auVar43 = *(undefined1 (*) [32])((long)*ptr_00 + lVar31);
                  auVar45 = *(undefined1 (*) [32])((long)*palVar39 + lVar31);
                  auVar44 = *(undefined1 (*) [32])((long)*local_260 + lVar31);
                  auVar11 = *(undefined1 (*) [32])((long)*local_268 + lVar31);
                  lVar31 = lVar31 + 0x20;
                  lVar33 = lVar33 + uVar35 * 4;
                } while (size << 5 != lVar31);
                iVar29 = 0;
                do {
                  auVar43 = vpermps_avx2(_DAT_008d4780,auVar57._0_32_);
                  auVar43 = vblendps_avx(auVar43,ZEXT432(1),1);
                  auVar57 = ZEXT3264(auVar43);
                  auVar45 = auVar47._0_32_;
                  auVar43 = vperm2f128_avx(auVar45,auVar45,0x28);
                  auVar43 = vpalignr_avx2(auVar45,auVar43,0xc);
                  auVar47 = ZEXT3264(auVar43);
                  auVar45 = auVar49._0_32_;
                  auVar43 = vperm2f128_avx(auVar45,auVar45,0x28);
                  auVar43 = vpalignr_avx2(auVar45,auVar43,0xc);
                  auVar49 = ZEXT3264(auVar43);
                  auVar43 = vpermps_avx2(_DAT_008d4780,auVar52._0_32_);
                  auVar43 = vblendps_avx(auVar43,ZEXT432((uint)-open),1);
                  auVar52 = ZEXT3264(auVar43);
                  alVar4 = ptr_00[uVar28];
                  auVar43 = vperm2i128_avx2((undefined1  [32])alVar4,(undefined1  [32])alVar4,0x28);
                  auVar43 = vpalignr_avx2((undefined1  [32])alVar4,auVar43,0xc);
                  lVar31 = 0;
                  lVar33 = lVar34;
                  do {
                    auVar43 = vpaddd_avx2(auVar43,*(undefined1 (*) [32])
                                                   ((long)pvVar7 + lVar31 + lVar30));
                    auVar43 = vpmaxsd_avx2(auVar43,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                    auVar45 = *(undefined1 (*) [32])((long)*b + lVar31);
                    auVar51 = auVar52._0_32_;
                    auVar14 = vpmaxsd_avx2(auVar45,auVar51);
                    *(undefined1 (*) [32])((long)*b + lVar31) = auVar14;
                    auVar44 = vpcmpeqd_avx2(auVar14,auVar43);
                    auVar45 = vpcmpgtd_avx2(auVar45,auVar51);
                    auVar11 = vpor_avx2(auVar44,auVar45);
                    auVar48 = auVar49._0_32_;
                    auVar45 = vblendvps_avx(auVar48,*(undefined1 (*) [32])((long)*b_00 + lVar31),
                                            auVar11);
                    *(undefined1 (*) [32])((long)*b_00 + lVar31) = auVar45;
                    auVar46 = auVar47._0_32_;
                    auVar44 = vblendvps_avx(auVar46,*(undefined1 (*) [32])((long)*b_01 + lVar31),
                                            auVar11);
                    *(undefined1 (*) [32])((long)*b_01 + lVar31) = auVar44;
                    auVar56 = auVar57._0_32_;
                    auVar11 = vblendvps_avx(auVar56,*(undefined1 (*) [32])((long)*b_02 + lVar31),
                                            auVar11);
                    *(undefined1 (*) [32])((long)*b_02 + lVar31) = auVar11;
                    lVar41 = *(long *)((long)((result->field_4).trace)->trace_del_table + 8);
                    *(int *)(lVar41 + lVar33) = auVar45._0_4_;
                    lVar41 = lVar41 + lVar33;
                    auVar54 = auVar45._0_16_;
                    uVar6 = vextractps_avx(auVar54,1);
                    *(undefined4 *)(lVar2 + lVar41) = uVar6;
                    uVar6 = vextractps_avx(auVar54,2);
                    *(undefined4 *)(lVar3 + lVar41) = uVar6;
                    uVar6 = vextractps_avx(auVar54,3);
                    *(undefined4 *)(lVar17 + lVar41) = uVar6;
                    auVar54 = auVar45._16_16_;
                    *(int *)(lVar38 + lVar41) = auVar45._16_4_;
                    uVar6 = vextractps_avx(auVar54,1);
                    *(undefined4 *)(lVar18 + lVar41) = uVar6;
                    uVar6 = vextractps_avx(auVar54,2);
                    *(undefined4 *)(lVar37 + lVar41) = uVar6;
                    uVar6 = vextractps_avx(auVar54,3);
                    *(undefined4 *)(lVar19 + lVar41) = uVar6;
                    lVar41 = *(long *)((long)((result->field_4).trace)->trace_del_table + 0x10);
                    *(int *)(lVar41 + lVar33) = auVar44._0_4_;
                    lVar41 = lVar41 + lVar33;
                    auVar54 = auVar44._0_16_;
                    uVar6 = vextractps_avx(auVar54,1);
                    *(undefined4 *)(lVar2 + lVar41) = uVar6;
                    uVar6 = vextractps_avx(auVar54,2);
                    *(undefined4 *)(lVar3 + lVar41) = uVar6;
                    uVar6 = vextractps_avx(auVar54,3);
                    *(undefined4 *)(lVar17 + lVar41) = uVar6;
                    auVar54 = auVar44._16_16_;
                    *(int *)(lVar38 + lVar41) = auVar44._16_4_;
                    uVar6 = vextractps_avx(auVar54,1);
                    *(undefined4 *)(lVar18 + lVar41) = uVar6;
                    uVar6 = vextractps_avx(auVar54,2);
                    *(undefined4 *)(lVar37 + lVar41) = uVar6;
                    uVar6 = vextractps_avx(auVar54,3);
                    *(undefined4 *)(lVar19 + lVar41) = uVar6;
                    lVar41 = *(long *)((long)((result->field_4).trace)->trace_del_table + 0x18);
                    *(int *)(lVar41 + lVar33) = auVar11._0_4_;
                    lVar41 = lVar41 + lVar33;
                    auVar54 = auVar11._0_16_;
                    uVar6 = vextractps_avx(auVar54,1);
                    *(undefined4 *)(lVar2 + lVar41) = uVar6;
                    uVar6 = vextractps_avx(auVar54,2);
                    *(undefined4 *)(lVar3 + lVar41) = uVar6;
                    uVar6 = vextractps_avx(auVar54,3);
                    *(undefined4 *)(lVar17 + lVar41) = uVar6;
                    auVar54 = auVar11._16_16_;
                    *(int *)(lVar38 + lVar41) = auVar11._16_4_;
                    uVar6 = vextractps_avx(auVar54,1);
                    *(undefined4 *)(lVar18 + lVar41) = uVar6;
                    uVar6 = vextractps_avx(auVar54,2);
                    *(undefined4 *)(lVar37 + lVar41) = uVar6;
                    uVar6 = vextractps_avx(auVar54,3);
                    *(undefined4 *)(lVar19 + lVar41) = uVar6;
                    lVar41 = *((result->field_4).trace)->trace_del_table;
                    *(int *)(lVar41 + lVar33) = auVar14._0_4_;
                    lVar41 = lVar41 + lVar33;
                    *(int *)(lVar2 + lVar41) = auVar14._4_4_;
                    *(int *)(lVar3 + lVar41) = auVar14._8_4_;
                    *(int *)(lVar17 + lVar41) = auVar14._12_4_;
                    *(int *)(lVar38 + lVar41) = auVar14._16_4_;
                    *(int *)(lVar18 + lVar41) = auVar14._20_4_;
                    *(int *)(lVar37 + lVar41) = auVar14._24_4_;
                    *(int *)(lVar19 + lVar41) = auVar14._28_4_;
                    auVar5._4_4_ = open;
                    auVar5._0_4_ = open;
                    auVar5._8_4_ = open;
                    auVar5._12_4_ = open;
                    auVar5._16_4_ = open;
                    auVar5._20_4_ = open;
                    auVar5._24_4_ = open;
                    auVar5._28_4_ = open;
                    auVar12 = vpsubd_avx2(auVar14,auVar5);
                    auVar13._4_4_ = gap;
                    auVar13._0_4_ = gap;
                    auVar13._8_4_ = gap;
                    auVar13._12_4_ = gap;
                    auVar13._16_4_ = gap;
                    auVar13._20_4_ = gap;
                    auVar13._24_4_ = gap;
                    auVar13._28_4_ = gap;
                    auVar51 = vpsubd_avx2(auVar51,auVar13);
                    auVar5 = vpcmpeqd_avx2(auVar12,auVar51);
                    auVar13 = vpcmpgtd_avx2(auVar51,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                    auVar5 = vpand_avx2(auVar5,auVar13);
                    auVar13 = vpcmpgtd_avx2(auVar51,auVar12);
                    auVar5 = vpor_avx2(auVar5,auVar13);
                    if ((((((((auVar5 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar5 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar5 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar5 >> 0x7f,0) == '\0') &&
                          (auVar5 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar5 >> 0xbf,0) == '\0') &&
                        (auVar5 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar5[0x1f]) {
                      iVar40 = 0x1e;
                    }
                    else {
                      auVar43 = vpcmpgtd_avx2(auVar12,auVar51);
                      auVar48 = vblendvps_avx(auVar48,auVar45,auVar43);
                      auVar46 = vblendvps_avx(auVar46,auVar44,auVar43);
                      auVar43 = vblendvps_avx(auVar56,auVar11,auVar43);
                      auVar56 = vpsubd_avx2(auVar43,_DAT_008d4ac0);
                      auVar43 = *(undefined1 (*) [32])((long)*ptr_00 + lVar31);
                      iVar40 = 0;
                      auVar52 = ZEXT3264(auVar51);
                    }
                    auVar57 = ZEXT3264(auVar56);
                    auVar45 = vpmaxsd_avx2(auVar55._0_32_,auVar45);
                    auVar44 = vpmaxsd_avx2(auVar44,auVar11);
                    auVar45 = vpmaxsd_avx2(auVar45,auVar44);
                    auVar55 = ZEXT3264(auVar45);
                    auVar44 = vpmaxsd_avx2(auVar14,auVar53._0_32_);
                    auVar53 = ZEXT3264(auVar44);
                    auVar47 = ZEXT3264(auVar46);
                    auVar49 = ZEXT3264(auVar48);
                    if ((((((((((((((((((((((((((((((((auVar5 >> 7 & (undefined1  [32])0x1) ==
                                                      (undefined1  [32])0x0 &&
                                                     (auVar5 >> 0xf & (undefined1  [32])0x1) ==
                                                     (undefined1  [32])0x0) &&
                                                    (auVar5 >> 0x17 & (undefined1  [32])0x1) ==
                                                    (undefined1  [32])0x0) &&
                                                   (auVar5 >> 0x1f & (undefined1  [32])0x1) ==
                                                   (undefined1  [32])0x0) &&
                                                  (auVar5 >> 0x27 & (undefined1  [32])0x1) ==
                                                  (undefined1  [32])0x0) &&
                                                 (auVar5 >> 0x2f & (undefined1  [32])0x1) ==
                                                 (undefined1  [32])0x0) &&
                                                (auVar5 >> 0x37 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0) &&
                                               (auVar5 >> 0x3f & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar5 >> 0x47 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (auVar5 >> 0x4f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar5 >> 0x57 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (auVar5 >> 0x5f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar5 >> 0x67 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         (auVar5 >> 0x6f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (auVar5 >> 0x77 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) && SUB321(auVar5 >> 0x7f,0) == '\0')
                                      && (auVar5 >> 0x87 & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                     (auVar5 >> 0x8f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar5 >> 0x97 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar5 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                   ) && (auVar5 >> 0xa7 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                 (auVar5 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                                && (auVar5 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                ) && SUB321(auVar5 >> 0xbf,0) == '\0') &&
                              (auVar5 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                             (auVar5 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar5 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar5 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar5 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (auVar5 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar5 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        -1 < auVar5[0x1f]) goto LAB_007c9e13;
                    lVar31 = lVar31 + 0x20;
                    lVar33 = lVar33 + uVar35 * 4;
                  } while (size << 5 != lVar31);
                  iVar40 = 0;
LAB_007c9e13:
                  if (iVar40 != 0) {
                    if (iVar40 != 0x1e) {
                      bVar42 = false;
                      goto LAB_007c9edb;
                    }
                    break;
                  }
                  iVar29 = iVar29 + 1;
                } while (iVar29 != 8);
                auVar43 = vpcmpgtd_avx2(auVar44,local_b8);
                bVar42 = true;
                if ((((((((auVar43 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar43 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar43 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar43 >> 0x7f,0) != '\0') ||
                      (auVar43 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar43 >> 0xbf,0) != '\0') ||
                    (auVar43 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar43[0x1f] < '\0') {
                  auVar43 = vpermq_avx2(auVar44,0x44);
                  auVar43 = vpmaxsd_avx2(auVar44,auVar43);
                  auVar44 = vpslldq_avx2(auVar43,8);
                  auVar43 = vpmaxsd_avx2(auVar43,auVar44);
                  auVar44 = vpslldq_avx2(auVar43,4);
                  auVar43 = vpmaxsd_avx2(auVar43,auVar44);
                  iVar58 = auVar43._28_4_;
                  bVar42 = iVar58 <= 0x7ffffffe - iVar27;
                  if (bVar42) {
                    auVar44._8_4_ = 7;
                    auVar44._0_8_ = 0x700000007;
                    auVar44._12_4_ = 7;
                    auVar44._16_4_ = 7;
                    auVar44._20_4_ = 7;
                    auVar44._24_4_ = 7;
                    auVar44._28_4_ = 7;
                    local_b8 = vpermd_avx2(auVar44,auVar43);
                    local_254 = (int)uVar32;
                  }
                  else {
                    *(byte *)&result->flag = (byte)result->flag | 0x40;
                  }
                }
LAB_007c9edb:
                local_1e8 = uVar32;
                local_218 = palVar39;
                if (!bVar42) break;
                uVar32 = uVar32 + 1;
                lVar34 = lVar34 + 4;
                palVar25 = ptr_00;
                palVar26 = local_268;
                local_248 = palVar20;
                local_1e8 = uVar35;
              } while (uVar32 != uVar35);
              if ((iVar58 == 0x7fffffff) ||
                 (auVar43._8_4_ = 0x7fffffff, auVar43._0_8_ = 0x7fffffff7fffffff,
                 auVar43._12_4_ = 0x7fffffff, auVar43._16_4_ = 0x7fffffff,
                 auVar43._20_4_ = 0x7fffffff, auVar43._24_4_ = 0x7fffffff,
                 auVar43._28_4_ = 0x7fffffff, auVar43 = vpcmpeqd_avx2(auVar45,auVar43),
                 (((((((auVar43 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                      (auVar43 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar43 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    SUB321(auVar43 >> 0x7f,0) != '\0') ||
                   (auVar43 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  SUB321(auVar43 >> 0xbf,0) != '\0') ||
                 (auVar43 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 auVar43[0x1f] < '\0')) {
                *(byte *)&result->flag = (byte)result->flag | 0x40;
              }
              iVar29 = parasail_result_is_saturated(result);
              iVar27 = 0;
              palVar25 = local_268;
              if (iVar29 == 0) {
                palVar26 = b;
                ptr = local_238;
                palVar21 = b_02;
                ptr_01 = local_240;
                ptr_02 = b_01;
                ptr_03 = b_00;
                palVar22 = local_228;
                palVar23 = palVar20;
                if ((local_254 != (int)local_1e8 + -1) &&
                   (palVar26 = local_238, ptr = b, palVar21 = local_228, ptr_01 = b_00,
                   ptr_02 = palVar20, ptr_03 = local_240, palVar22 = b_02, palVar23 = b_01,
                   local_254 == (int)local_1e8 + -2)) {
                  palVar26 = ptr_00;
                  palVar21 = local_268;
                  ptr_00 = local_238;
                  ptr_02 = local_260;
                  ptr_03 = palVar39;
                  palVar25 = local_228;
                  local_250 = palVar20;
                  local_218 = local_240;
                }
                local_260 = palVar23;
                local_268 = palVar22;
                local_228 = palVar21;
                local_118 = SUB84(palVar26,0);
                uStack_114 = (undefined4)((ulong)palVar26 >> 0x20);
                if ((uVar1 & 0x7ffffff8) == 0) {
                  iVar27 = -0x40000000;
                  iVar40 = -0x40000000;
                  iVar29 = -0x40000000;
                }
                else {
                  iVar29 = -0x40000000;
                  uVar35 = 0;
                  iVar40 = -0x40000000;
                  iVar27 = -0x40000000;
                  do {
                    if ((*(int *)((long)*palVar26 + uVar35 * 4) == iVar58) &&
                       (uVar36 = ((uint)uVar35 & 7) * uVar16 + ((uint)(uVar35 >> 3) & 0x1fffffff),
                       (int)uVar36 < (int)uVar24)) {
                      iVar29 = *(int *)((long)*ptr_03 + uVar35 * 4);
                      iVar27 = *(int *)((long)*ptr_02 + uVar35 * 4);
                      iVar40 = *(int *)((long)*local_228 + uVar35 * 4);
                      uVar24 = (ulong)uVar36;
                    }
                    uVar36 = (uint)uVar24;
                    uVar35 = uVar35 + 1;
                  } while ((uVar16 & 0xfffffff) << 3 != (int)uVar35);
                }
              }
              else {
                iVar40 = 0;
                iVar29 = 0;
                iVar58 = 0;
                local_118 = SUB84(local_238,0);
                uStack_114 = (undefined4)((ulong)local_238 >> 0x20);
                local_254 = 0;
                uVar36 = 0;
                ptr = b;
                ptr_01 = b_00;
                ptr_02 = palVar20;
                ptr_03 = local_240;
                local_268 = b_02;
                local_260 = b_01;
              }
              result->score = iVar58;
              result->end_query = uVar36;
              result->end_ref = local_254;
              ((result->field_4).stats)->matches = iVar29;
              ((result->field_4).stats)->similar = iVar27;
              ((result->field_4).stats)->length = iVar40;
              parasail_free(local_228);
              parasail_free(ptr_02);
              parasail_free(ptr_03);
              parasail_free((void *)CONCAT44(uStack_114,local_118));
              parasail_free(b_06);
              parasail_free(b_05);
              parasail_free(b_04);
              parasail_free(b_03);
              parasail_free(palVar25);
              parasail_free(local_268);
              parasail_free(local_250);
              parasail_free(local_260);
              parasail_free(local_218);
              parasail_free(ptr_01);
              parasail_free(ptr_00);
              parasail_free(ptr);
              return result;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

STATIC parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m256i* restrict vProfile = NULL;
    __m256i* restrict vProfileM = NULL;
    __m256i* restrict vProfileS = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvHMStore = NULL;
    __m256i* restrict pvHMLoad = NULL;
    __m256i* restrict pvHSStore = NULL;
    __m256i* restrict pvHSLoad = NULL;
    __m256i* restrict pvHLStore = NULL;
    __m256i* restrict pvHLLoad = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvEM = NULL;
    __m256i* restrict pvES = NULL;
    __m256i* restrict pvEL = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvHMMax = NULL;
    __m256i* restrict pvHSMax = NULL;
    __m256i* restrict pvHLMax = NULL;
    __m256i vGapO;
    __m256i vGapE;
    __m256i vZero;
    __m256i vOne;
    int32_t score = 0;
    int32_t matches = 0;
    int32_t similar = 0;
    int32_t length = 0;
    __m256i vMaxH;
    __m256i vMaxHUnit;
    __m256i vSaturationCheckMax;
    __m256i vPosLimit;
    int32_t maxp = 0;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile  = (__m256i*)profile->profile32.score;
    vProfileM = (__m256i*)profile->profile32.matches;
    vProfileS = (__m256i*)profile->profile32.similar;
    vGapO = _mm256_set1_epi32(open);
    vGapE = _mm256_set1_epi32(gap);
    vZero = _mm256_setzero_si256();
    vOne = _mm256_set1_epi32(1);
    score = NEG_INF;
    matches = NEG_INF;
    similar = NEG_INF;
    length = NEG_INF;
    vMaxH = vZero;
    vMaxHUnit = vZero;
    vSaturationCheckMax = vZero;
    vPosLimit = _mm256_set1_epi32(INT32_MAX);
    maxp = INT32_MAX - (int32_t)(matrix->max+1);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m256i(32, segLen);
    pvHLoad   = parasail_memalign___m256i(32, segLen);
    pvHMStore = parasail_memalign___m256i(32, segLen);
    pvHMLoad  = parasail_memalign___m256i(32, segLen);
    pvHSStore = parasail_memalign___m256i(32, segLen);
    pvHSLoad  = parasail_memalign___m256i(32, segLen);
    pvHLStore = parasail_memalign___m256i(32, segLen);
    pvHLLoad  = parasail_memalign___m256i(32, segLen);
    pvE       = parasail_memalign___m256i(32, segLen);
    pvEM      = parasail_memalign___m256i(32, segLen);
    pvES      = parasail_memalign___m256i(32, segLen);
    pvEL      = parasail_memalign___m256i(32, segLen);
    pvHMax    = parasail_memalign___m256i(32, segLen);
    pvHMMax   = parasail_memalign___m256i(32, segLen);
    pvHSMax   = parasail_memalign___m256i(32, segLen);
    pvHLMax   = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;

    parasail_memset___m256i(pvHStore, vZero, segLen);
    parasail_memset___m256i(pvHMStore, vZero, segLen);
    parasail_memset___m256i(pvHSStore, vZero, segLen);
    parasail_memset___m256i(pvHLStore, vZero, segLen);
    parasail_memset___m256i(pvE, _mm256_set1_epi32(-open), segLen);
    parasail_memset___m256i(pvEM, vZero, segLen);
    parasail_memset___m256i(pvES, vZero, segLen);
    parasail_memset___m256i(pvEL, vOne, segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vEF_opn;
        __m256i vE;
        __m256i vE_ext;
        __m256i vEM;
        __m256i vES;
        __m256i vEL;
        __m256i vF;
        __m256i vF_ext;
        __m256i vFM;
        __m256i vFS;
        __m256i vFL;
        __m256i vH;
        __m256i vH_dag;
        __m256i vHM;
        __m256i vHS;
        __m256i vHL;
        const __m256i* vP = NULL;
        const __m256i* vPM = NULL;
        const __m256i* vPS = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = vZero;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 4 bytes */
        vH = _mm256_load_si256(&pvHStore[segLen - 1]);
        vHM = _mm256_load_si256(&pvHMStore[segLen - 1]);
        vHS = _mm256_load_si256(&pvHSStore[segLen - 1]);
        vHL = _mm256_load_si256(&pvHLStore[segLen - 1]);
        vH = _mm256_slli_si256_rpl(vH, 4);
        vHM = _mm256_slli_si256_rpl(vHM, 4);
        vHS = _mm256_slli_si256_rpl(vHS, 4);
        vHL = _mm256_slli_si256_rpl(vHL, 4);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            SWAP3(pvHMax,  pvHLoad,  pvHStore)
            SWAP3(pvHMMax, pvHMLoad, pvHMStore)
            SWAP3(pvHSMax, pvHSLoad, pvHSStore)
            SWAP3(pvHLMax, pvHLLoad, pvHLStore)
        }
        else {
            /* Swap the 2 H buffers. */
            SWAP(pvHLoad,  pvHStore)
            SWAP(pvHMLoad, pvHMStore)
            SWAP(pvHSLoad, pvHSStore)
            SWAP(pvHLLoad, pvHLStore)
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m256i cond_zero;
            __m256i case1;
            __m256i case2;

            vE = _mm256_load_si256(pvE+ i);
            vEM = _mm256_load_si256(pvEM+ i);
            vES = _mm256_load_si256(pvES+ i);
            vEL = _mm256_load_si256(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm256_add_epi32(vH, _mm256_load_si256(vP + i));
            vH_dag = _mm256_max_epi32(vH_dag, vZero);
            vH = _mm256_max_epi32(vH_dag, vE);
            vH = _mm256_max_epi32(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
            cond_zero = _mm256_cmpeq_epi32(vH, vZero);

            case1 = _mm256_cmpeq_epi32(vH, vH_dag);
            case2 = _mm256_cmpeq_epi32(vH, vF);

            /* calculate vM */
            vHM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    _mm256_add_epi32(vHM, _mm256_load_si256(vPM + i)), case1);
            vHM = _mm256_andnot_si256(cond_zero, vHM);
            _mm256_store_si256(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    _mm256_add_epi32(vHS, _mm256_load_si256(vPS + i)), case1);
            vHS = _mm256_andnot_si256(cond_zero, vHS);
            _mm256_store_si256(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    _mm256_add_epi32(vHL, vOne), case1);
            vHL = _mm256_andnot_si256(cond_zero, vHL);
            _mm256_store_si256(pvHLStore + i, vHL);

            vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm256_max_epi32(vH, vMaxH);
            vEF_opn = _mm256_sub_epi32(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm256_sub_epi32(vE, vGapE);
            vE = _mm256_max_epi32(vEF_opn, vE_ext);
            case1 = _mm256_cmpgt_epi32(vEF_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vHM, case1);
            vES = _mm256_blendv_epi8(vES, vHS, case1);
            vEL = _mm256_blendv_epi8(
                    _mm256_add_epi32(vEL, vOne),
                    _mm256_add_epi32(vHL, vOne),
                    case1);
            _mm256_store_si256(pvE + i, vE);
            _mm256_store_si256(pvEM + i, vEM);
            _mm256_store_si256(pvES + i, vES);
            _mm256_store_si256(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm256_sub_epi32(vF, vGapE);
            vF = _mm256_max_epi32(vEF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi32(vEF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vHM, case1);
            vFS = _mm256_blendv_epi8(vFS, vHS, case1);
            vFL = _mm256_blendv_epi8(
                    _mm256_add_epi32(vFL, vOne),
                    _mm256_add_epi32(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
            vHM = _mm256_load_si256(pvHMLoad + i);
            vHS = _mm256_load_si256(pvHSLoad + i);
            vHL = _mm256_load_si256(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m256i vHp = _mm256_load_si256(&pvHLoad[segLen - 1]);
            vHp = _mm256_slli_si256_rpl(vHp, 4);
            vF = _mm256_slli_si256_rpl(vF, 4);
            vF = _mm256_insert_epi32_rpl(vF, -open, 0);
            vFM = _mm256_slli_si256_rpl(vFM, 4);
            vFS = _mm256_slli_si256_rpl(vFS, 4);
            vFL = _mm256_slli_si256_rpl(vFL, 4);
            vFL = _mm256_insert_epi32_rpl(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m256i case1;
                __m256i case2;
                __m256i cond;

                vHp = _mm256_add_epi32(vHp, _mm256_load_si256(vP + i));
                vHp = _mm256_max_epi32(vHp, vZero);
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi32(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
                case1 = _mm256_cmpeq_epi32(vH, vHp);
                case2 = _mm256_cmpeq_epi32(vH, vF);
                cond = _mm256_andnot_si256(case1, case2);

                /* calculate vM */
                vHM = _mm256_load_si256(pvHMStore + i);
                vHM = _mm256_blendv_epi8(vHM, vFM, cond);
                _mm256_store_si256(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm256_load_si256(pvHSStore + i);
                vHS = _mm256_blendv_epi8(vHS, vFS, cond);
                _mm256_store_si256(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm256_load_si256(pvHLStore + i);
                vHL = _mm256_blendv_epi8(vHL, vFL, cond);
                _mm256_store_si256(pvHLStore + i, vHL);

                vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vMaxH = _mm256_max_epi32(vH, vMaxH);
                /* Update vF value. */
                vEF_opn = _mm256_sub_epi32(vH, vGapO);
                vF_ext = _mm256_sub_epi32(vF, vGapE);
                if (! _mm256_movemask_epi8(
                            _mm256_or_si256(
                                _mm256_cmpgt_epi32(vF_ext, vEF_opn),
                                _mm256_and_si256(
                                    _mm256_cmpeq_epi32(vF_ext, vEF_opn),
                                    _mm256_cmpgt_epi32(vF_ext, vZero)))))
                    goto end;
                /*vF = _mm256_max_epi32(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm256_cmpgt_epi32(vEF_opn, vF_ext);
                vFM = _mm256_blendv_epi8(vFM, vHM, cond);
                vFS = _mm256_blendv_epi8(vFS, vHS, cond);
                vFL = _mm256_blendv_epi8(
                        _mm256_add_epi32(vFL, vOne),
                        _mm256_add_epi32(vHL, vOne),
                        cond);
                vHp = _mm256_load_si256(pvHLoad + i);
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvHStore + offset);
            vHM = _mm256_load_si256(pvHMStore + offset);
            vHS = _mm256_load_si256(pvHSStore + offset);
            vHL = _mm256_load_si256(pvHLStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 4);
                vHM = _mm256_slli_si256_rpl(vHM, 4);
                vHS = _mm256_slli_si256_rpl(vHS, 4);
                vHL = _mm256_slli_si256_rpl(vHL, 4);
            }
            result->stats->rowcols->score_row[j] = (int32_t) _mm256_extract_epi32_rpl (vH, 7);
            result->stats->rowcols->matches_row[j] = (int32_t) _mm256_extract_epi32_rpl (vHM, 7);
            result->stats->rowcols->similar_row[j] = (int32_t) _mm256_extract_epi32_rpl (vHS, 7);
            result->stats->rowcols->length_row[j] = (int32_t) _mm256_extract_epi32_rpl (vHL, 7);
        }
#endif

        {
            __m256i vCompare = _mm256_cmpgt_epi32(vMaxH, vMaxHUnit);
            if (_mm256_movemask_epi8(vCompare)) {
                score = _mm256_hmax_epi32_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm256_set1_epi32(score);
                end_ref = j;
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        __m256i vHM = _mm256_load_si256(pvHMStore+i);
        __m256i vHS = _mm256_load_si256(pvHSStore+i);
        __m256i vHL = _mm256_load_si256(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    if (score == INT32_MAX
            || _mm256_movemask_epi8(_mm256_cmpeq_epi32(vSaturationCheckMax,vPosLimit))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = 0;
        end_query = 0;
        end_ref = 0;
        matches = 0;
        similar = 0;
        length = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            SWAP(pvHMax,  pvHStore)
            SWAP(pvHMMax, pvHMStore)
            SWAP(pvHSMax, pvHSStore)
            SWAP(pvHLMax, pvHLStore)
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            SWAP(pvHMax,  pvHLoad)
            SWAP(pvHMMax, pvHMLoad)
            SWAP(pvHSMax, pvHSLoad)
            SWAP(pvHLMax, pvHLLoad)
        }
        /* Trace the alignment ending position on read. */
        {
            int32_t *t = (int32_t*)pvHMax;
            int32_t *m = (int32_t*)pvHMMax;
            int32_t *s = (int32_t*)pvHSMax;
            int32_t *l = (int32_t*)pvHLMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len;
            for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                        matches = *m;
                        similar = *s;
                        length = *l;
                    }
                }
            }
        }
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}